

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_reset(Parser *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  bool bVar5;
  size_t sVar6;
  State *this_00;
  csubstr cVar7;
  size_t local_c0;
  char msg [36];
  undefined4 uStack_94;
  
  if ((this->m_stack).m_size != 1) {
    builtin_strncpy(msg + 0x10,"_stack.s",8);
    builtin_strncpy(msg,"check failed: (m",0x10);
    builtin_strncpy(msg + 0x18,"ize() == 1)",0xc);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_c0 = cVar7.len;
    auVar4 = ZEXT1224(ZEXT412(0x6b6f) << 0x40);
    LVar3.name.str._0_4_ = (int)cVar7.str;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = cVar7.str._4_4_;
    LVar3.name.len = local_c0;
    (*p_Var1)(msg,0x24,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  (this->m_stack).m_size = 0;
  msg._0_8_ = msg._0_8_ & 0xffffffff00000000;
  memset(msg + 8,0,0x90);
  detail::stack<c4::yml::Parser::State,_16UL>::push(&this->m_stack,(State *)msg);
  sVar6 = (this->m_stack).m_size;
  if (sVar6 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    join_0x00000010_0x00000000_ =
         to_csubstr(
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = '\\';
    msg[9] = '\\';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    (*(code *)PTR_error_impl_002867d8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar6 = (this->m_stack).m_size;
  }
  this_00 = (this->m_stack).m_stack + (sVar6 - 1);
  this->m_state = this_00;
  State::reset(this_00,(this->m_file).str,this->m_root_id);
  *(undefined8 *)((long)&(this->m_val_tag).str + 1) = 0;
  *(undefined8 *)((long)&(this->m_val_tag).len + 1) = 0;
  this->m_val_tag_indentation = 0;
  (this->m_val_tag).str = (char *)0x0;
  (this->m_key_tag2).str = (char *)0x0;
  (this->m_key_tag2).len = 0;
  (this->m_key_tag).str = (char *)0x0;
  (this->m_key_tag).len = 0;
  this->m_key_tag_indentation = 0;
  this->m_key_tag2_indentation = 0;
  this->m_key_anchor_indentation = 0;
  (this->m_key_anchor).str = (char *)0x0;
  (this->m_key_anchor).len = 0;
  this->m_val_anchor_indentation = 0;
  (this->m_val_anchor).str = (char *)0x0;
  (this->m_val_anchor).len = 0;
  if (((this->m_options).flags & 1) != 0) {
    _prepare_locations(this);
  }
  return;
}

Assistant:

void Parser::_reset()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.size() == 1);
    m_stack.clear();
    m_stack.push({});
    m_state = &m_stack.top();
    m_state->reset(m_file.str, m_root_id);

    m_key_tag_indentation = 0;
    m_key_tag2_indentation = 0;
    m_key_tag.clear();
    m_key_tag2.clear();
    m_val_tag_indentation = 0;
    m_val_tag.clear();
    m_key_anchor_was_before = false;
    m_key_anchor_indentation = 0;
    m_key_anchor.clear();
    m_val_anchor_indentation = 0;
    m_val_anchor.clear();

    if(m_options.locations())
    {
        _prepare_locations();
    }
}